

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skeleton.cxx
# Opt level: O3

void __thiscall xray_re::s_joint_ik_data::reset(s_joint_ik_data *this)

{
  this->type = 0;
  this->limits[2].limit.field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  this->limits[2].spring_factor = 1.0;
  this->limits[2].damping_factor = 1.0;
  this->limits[1].limit.field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  this->limits[1].spring_factor = 1.0;
  this->limits[1].damping_factor = 1.0;
  this->limits[0].limit.field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  this->limits[0].spring_factor = 1.0;
  this->limits[0].damping_factor = 1.0;
  this->spring_factor = 1.0;
  this->damping_factor = 1.0;
  this->ik_flags = 0;
  this->break_force = 0.0;
  this->break_torque = 0.0;
  this->friction = 1.0;
  return;
}

Assistant:

void s_joint_ik_data::reset()
{
	type = JT_RIGID;
	for (uint_fast32_t i = 3; i != 0;)
		limits[--i].reset();
	spring_factor = 1.f;
	damping_factor = 1.f;
	ik_flags = 0;
	break_force = 0;
	break_torque = 0;
	friction = 1.f;
}